

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mFILE.c
# Opt level: O0

void mfrecreate(mFILE *mf,char *data,int size)

{
  int size_local;
  char *data_local;
  mFILE *mf_local;
  
  if (mf->data != (char *)0x0) {
    free(mf->data);
  }
  mf->data = data;
  mf->size = (long)size;
  mf->alloced = (long)size;
  mf->eof = 0;
  mf->offset = 0;
  mf->flush_pos = 0;
  return;
}

Assistant:

void mfrecreate(mFILE *mf, char *data, int size) {
    if (mf->data)
	free(mf->data);
    mf->data = data;
    mf->size = size;
    mf->alloced = size;
    mf->eof = 0;
    mf->offset = 0;
    mf->flush_pos = 0;
}